

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-vec.h
# Opt level: O0

void mp::AutoExpand<std::vector<bool,std::allocator<bool>>>
               (vector<bool,_std::allocator<bool>_> *vec,size_type i,value_type_conflict1 v)

{
  byte bVar1;
  vector<bool,_std::allocator<bool>_> *pvVar2;
  byte in_DL;
  vector<bool,_std::allocator<bool>_> *in_RSI;
  vector<bool,_std::allocator<bool>_> *unaff_retaddr;
  vector<bool,_std::allocator<bool>_> *in_stack_00000010;
  bool in_stack_00000067;
  size_type in_stack_00000068;
  vector<bool,_std::allocator<bool>_> *in_stack_00000070;
  _Bit_reference in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  pvVar2 = (vector<bool,_std::allocator<bool>_> *)
           std::vector<bool,_std::allocator<bool>_>::size(in_stack_00000010);
  if (pvVar2 <= in_RSI) {
    pvVar2 = (vector<bool,_std::allocator<bool>_> *)
             std::vector<bool,_std::allocator<bool>_>::capacity(unaff_retaddr);
    if (pvVar2 <= in_RSI) {
      std::vector<bool,_std::allocator<bool>_>::reserve
                ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffd8._M_mask,
                 (size_type)in_stack_ffffffffffffffd8._M_p);
    }
    std::vector<bool,_std::allocator<bool>_>::resize
              (in_stack_00000070,in_stack_00000068,in_stack_00000067);
  }
  std::vector<bool,_std::allocator<bool>_>::operator[]
            (in_RSI,CONCAT17(bVar1,in_stack_ffffffffffffffe8));
  std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffd8,(bool)(bVar1 & 1));
  return;
}

Assistant:

void AutoExpand(
		Vec& vec, typename Vec::size_type i, typename Vec::value_type v) {
  if (vec.size()<=i) {
    if (vec.capacity()<=i)
      vec.reserve(((i+1)*13)/10);
    vec.resize(i+1);
  }
	vec[i] = std::move(v);
}